

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::InstanceSymbol::InstanceSymbol
          (InstanceSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          DefinitionSymbol *definition,ParameterBuilder *paramBuilder,
          bitmask<slang::ast::InstanceFlags> flags)

{
  InstanceBodySymbol *pIVar1;
  
  pIVar1 = InstanceBodySymbol::fromDefinition(compilation,definition,loc,paramBuilder,flags);
  (this->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (this->super_InstanceSymbolBase).super_Symbol.name._M_len = name._M_len;
  (this->super_InstanceSymbolBase).super_Symbol.name._M_str = name._M_str;
  (this->super_InstanceSymbolBase).super_Symbol.location = loc;
  (this->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (this->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  this->body = pIVar1;
  this->resolvedConfig = (ResolvedConfig *)0x0;
  this->connectionMap = (PointerMap *)0x0;
  (this->connections)._M_ptr = (pointer)0x0;
  (this->connections)._M_extent._M_extent_value = 0;
  this->canonicalBody = (InstanceBodySymbol *)0x0;
  pIVar1->parentInstance = this;
  return;
}

Assistant:

InstanceSymbol::InstanceSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                               const DefinitionSymbol& definition, ParameterBuilder& paramBuilder,
                               bitmask<InstanceFlags> flags) :
    InstanceSymbol(name, loc,
                   InstanceBodySymbol::fromDefinition(compilation, definition, loc, paramBuilder,
                                                      flags)) {
}